

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.cc
# Opt level: O2

void usage(char *prog,char *verb,char *mode)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,prog);
  poVar1 = std::operator<<(poVar1," [-t] [-v]");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "  -t: test mode for persistence test, if -t is not given, the program only prepares data for test. [currently "
                          );
  poVar1 = std::operator<<(poVar1,mode);
  poVar1 = std::operator<<(poVar1,"]");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"  -v: print extra info for failed tests [currently ");
  poVar1 = std::operator<<((ostream *)&std::cout,verb);
  poVar1 = std::operator<<(poVar1,"]");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout," NOTE: A normal usage is as follows:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"    1. invoke `");
  poVar1 = std::operator<<(poVar1,prog);
  poVar1 = std::operator<<(poVar1,"`;");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"    2. terminate (kill) the program when data is ready;");
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"    3. invoke `");
  poVar1 = std::operator<<(poVar1,prog);
  poVar1 = std::operator<<(poVar1,"-t ` to test.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::ostream::flush();
  return;
}

Assistant:

void usage(const char *prog, const char *verb, const char *mode) {
    std::cout << "Usage: " << prog << " [-t] [-v]" << std::endl;
    std::cout << "  -t: test mode for persistence test,"
                 " if -t is not given, the program only prepares data for test."
                 " [currently " << mode << "]" << std::endl;
    std::cout << "  -v: print extra info for failed tests [currently ";
    std::cout << verb << "]" << std::endl;
    std::cout << std::endl;
    std::cout << " NOTE: A normal usage is as follows:" << std::endl;
    std::cout << "    1. invoke `" << prog << "`;" << std::endl;
    std::cout << "    2. terminate (kill) the program when data is ready;";
    std::cout << std::endl;
    std::cout << "    3. invoke `" << prog << "-t ` to test." << std::endl;
    std::cout << std::endl;
    std::cout.flush();
}